

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# event.c
# Opt level: O2

void event_base_add_virtual_(event_base *base)

{
  int iVar1;
  void *pvVar2;
  
  if (base->th_base_lock == (void *)0x0) {
    pvVar2 = (void *)0x0;
  }
  else {
    (*evthread_lock_fns_.lock)(0,base->th_base_lock);
    pvVar2 = base->th_base_lock;
  }
  iVar1 = base->virtual_event_count + 1;
  base->virtual_event_count = iVar1;
  if (iVar1 < base->virtual_event_count_max) {
    iVar1 = base->virtual_event_count_max;
  }
  base->virtual_event_count_max = iVar1;
  if (pvVar2 != (void *)0x0) {
    (*evthread_lock_fns_.unlock)(0,pvVar2);
    return;
  }
  return;
}

Assistant:

void
event_base_add_virtual_(struct event_base *base)
{
	EVBASE_ACQUIRE_LOCK(base, th_base_lock);
	base->virtual_event_count++;
	MAX_EVENT_COUNT(base->virtual_event_count_max, base->virtual_event_count);
	EVBASE_RELEASE_LOCK(base, th_base_lock);
}